

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

bool __thiscall
HSimplexNla::sparseLoopStyle(HSimplexNla *this,HighsInt count,HighsInt dim,HighsInt *to_entry)

{
  bool bVar1;
  bool local_1a;
  bool use_indices;
  HighsInt *to_entry_local;
  HighsInt dim_local;
  HighsInt count_local;
  HSimplexNla *this_local;
  
  bVar1 = (double)count < (double)dim * 0.4;
  local_1a = -1 < count && bVar1;
  if (-1 < count && bVar1) {
    *to_entry = count;
  }
  else {
    *to_entry = dim;
  }
  return local_1a;
}

Assistant:

bool HSimplexNla::sparseLoopStyle(const HighsInt count, const HighsInt dim,
                                  HighsInt& to_entry) const {
  // Parameter to decide whether to use just the values in a HVector, or
  // use the indices of their nonzeros
  const bool use_indices = count >= 0 && count < kDensityForIndexing * dim;
  if (use_indices) {
    to_entry = count;
  } else {
    to_entry = dim;
  }
  return use_indices;
}